

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

char * ply_get_next_comment(p_ply ply,char *last)

{
  char *last_local;
  p_ply ply_local;
  char *local_8;
  
  if (last == (char *)0x0) {
    local_8 = ply->comment;
  }
  else {
    local_8 = last + 0x400;
    if (ply->comment + ply->ncomments * 0x400 <= local_8) {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char *ply_get_next_comment(p_ply ply, const char *last) {
    assert(ply);
    if (!last) return ply->comment;
    last += LINESIZE;
    if (last < ply->comment + LINESIZE * ply->ncomments)
        return last;
    else
        return NULL;
}